

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

void xmlCleanupCharEncodingHandlers(void)

{
  xmlCharEncodingHandlerPtr pxVar1;
  ulong uVar2;
  
  xmlCleanupEncodingAliases();
  if (globalHandlers != (xmlCharEncodingHandlerPtr *)0x0) {
    uVar2 = (ulong)(uint)nbCharEncodingHandler;
    while (0 < (int)uVar2) {
      nbCharEncodingHandler = (int)uVar2 - 1;
      uVar2 = (ulong)(uint)nbCharEncodingHandler;
      pxVar1 = globalHandlers[uVar2];
      if (pxVar1 != (xmlCharEncodingHandlerPtr)0x0) {
        if (pxVar1->name != (char *)0x0) {
          (*xmlFree)(pxVar1->name);
        }
        (*xmlFree)(pxVar1);
        uVar2 = (ulong)(uint)nbCharEncodingHandler;
      }
    }
    (*xmlFree)(globalHandlers);
    globalHandlers = (xmlCharEncodingHandlerPtr *)0x0;
    nbCharEncodingHandler = 0;
  }
  return;
}

Assistant:

void
xmlCleanupCharEncodingHandlers(void) {
    xmlCleanupEncodingAliases();

    if (globalHandlers == NULL) return;

    for (;nbCharEncodingHandler > 0;) {
        xmlCharEncodingHandler *handler;

        nbCharEncodingHandler--;
        handler = globalHandlers[nbCharEncodingHandler];
	if (handler != NULL) {
	    if (handler->name != NULL)
		xmlFree(handler->name);
	    xmlFree(handler);
	}
    }
    xmlFree(globalHandlers);
    globalHandlers = NULL;
    nbCharEncodingHandler = 0;
}